

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_fullgc(lua_State *L,int isemergency)

{
  global_State *g;
  
  g = L->l_G;
  if (isemergency != 0) {
    g->gckind = '\x01';
  }
  if (g->gcstate < 2) {
    entersweep(L);
  }
  luaC_runtilstate(L,0x80);
  luaC_runtilstate(L,-0x81);
  luaC_runtilstate(L,0x40);
  luaC_runtilstate(L,0x80);
  g->gckind = '\0';
  setpause(g);
  return;
}

Assistant:

void luaC_fullgc(lua_State *L, int isemergency) {
    global_State *g = G(L);
    lua_assert(g->gckind == KGC_NORMAL);
    if (isemergency) g->gckind = KGC_EMERGENCY;  /* set flag */
    if (keepinvariant(g)) {  /* black objects? */
        entersweep(L); /* sweep everything to turn them back to white */
    }
    /* finish any pending sweep phase to start a new cycle */
    luaC_runtilstate(L, bitmask(GCSpause));
    luaC_runtilstate(L, ~bitmask(GCSpause));  /* start new collection */
    luaC_runtilstate(L, bitmask(GCScallfin));  /* run up to finalizers */
    /* estimate must be correct after a full GC cycle */
    lua_assert(g->GCestimate == gettotalbytes(g));
    luaC_runtilstate(L, bitmask(GCSpause));  /* finish collection */
    g->gckind = KGC_NORMAL;
    setpause(g);
}